

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
parse(basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this,
     item_event_visitor *visitor,error_code *ec)

{
  char_result<unsigned_char> cVar1;
  reference pvVar2;
  stream_source<unsigned_char> *this_00;
  size_type sVar3;
  assertion_error *this_01;
  allocator<char> *in_RDI;
  char_result<unsigned_char> c_1;
  char_result<unsigned_char> c;
  error_code *in_stack_00000170;
  item_event_visitor *in_stack_00000178;
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
  *in_stack_00000180;
  string *in_stack_ffffffffffffff68;
  error_code *in_stack_ffffffffffffff70;
  stream_source<unsigned_char> *in_stack_ffffffffffffff78;
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
  *in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff88;
  allocator<char> local_61;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffffac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  uchar local_1c;
  uchar local_1a;
  
  while( true ) {
    local_61 = (allocator<char>)0x0;
    if (((byte)in_RDI[9] & 1) == 0) {
      local_61 = in_RDI[8];
    }
    if (((byte)local_61 & 1) == 0) break;
    pvVar2 = std::vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
             ::back((vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
                     *)in_stack_ffffffffffffff70);
    this_00 = (stream_source<unsigned_char> *)(ulong)pvVar2->mode;
    switch(this_00) {
    case (stream_source<unsigned_char> *)0x0:
      pvVar2 = std::
               vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>::
               back((vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
                     *)in_stack_ffffffffffffff70);
      pvVar2->mode = accept;
      read_item(in_stack_00000180,in_stack_00000178,in_stack_00000170);
      break;
    case (stream_source<unsigned_char> *)0x1:
      sVar3 = std::vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
              ::size((vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
                      *)(in_RDI + 0x218));
      if (sVar3 != 1) {
        uVar4 = CONCAT13(1,(int3)in_stack_ffffffffffffffa8);
        this_01 = (assertion_error *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffffb0,(char *)CONCAT44(in_stack_ffffffffffffffac,uVar4),
                   in_RDI);
        assertion_error::assertion_error(this_01,in_stack_ffffffffffffff68);
        __cxa_throw(this_01,&assertion_error::typeinfo,assertion_error::~assertion_error);
      }
      std::vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>::clear
                ((vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
                  *)0x2e00d4);
      in_RDI[8] = (allocator<char>)0x0;
      in_RDI[9] = (allocator<char>)0x1;
      basic_item_event_visitor<char>::flush((basic_item_event_visitor<char> *)0x2e00ee);
      break;
    case (stream_source<unsigned_char> *)0x2:
      pvVar2 = std::
               vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>::
               back((vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
                     *)in_stack_ffffffffffffff70);
      in_stack_ffffffffffffff88 = pvVar2->index;
      pvVar2 = std::
               vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>::
               back((vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
                     *)in_stack_ffffffffffffff70);
      if (in_stack_ffffffffffffff88 < pvVar2->length) {
        pvVar2 = std::
                 vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>::
                 back((vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
                       *)in_stack_ffffffffffffff70);
        pvVar2->index = pvVar2->index + 1;
        read_item(in_stack_00000180,in_stack_00000178,in_stack_00000170);
      }
      else {
        end_array(in_stack_ffffffffffffff80,(item_event_visitor *)in_stack_ffffffffffffff78,
                  in_stack_ffffffffffffff70);
      }
      break;
    case (stream_source<unsigned_char> *)0x3:
      cVar1 = stream_source<unsigned_char>::peek(in_stack_ffffffffffffff78);
      if (((ushort)cVar1 & 0x100) != 0) {
        std::error_code::operator=
                  ((error_code *)in_stack_ffffffffffffff80,
                   (cbor_errc)((ulong)in_stack_ffffffffffffff78 >> 0x20));
        in_RDI[8] = (allocator<char>)0x0;
        return;
      }
      local_1a = cVar1.value;
      if (local_1a == 0xff) {
        stream_source<unsigned_char>::ignore(this_00,in_stack_ffffffffffffff88);
        end_array(in_stack_ffffffffffffff80,(item_event_visitor *)in_stack_ffffffffffffff78,
                  in_stack_ffffffffffffff70);
      }
      else {
        read_item(in_stack_00000180,in_stack_00000178,in_stack_00000170);
      }
      break;
    case (stream_source<unsigned_char> *)0x4:
      pvVar2 = std::
               vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>::
               back((vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
                     *)in_stack_ffffffffffffff70);
      in_stack_ffffffffffffff80 =
           (basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *)
           pvVar2->index;
      pvVar2 = std::
               vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>::
               back((vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
                     *)in_stack_ffffffffffffff70);
      if (in_stack_ffffffffffffff80 <
          (basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *)
          pvVar2->length) {
        pvVar2 = std::
                 vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>::
                 back((vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
                       *)in_stack_ffffffffffffff70);
        pvVar2->index = pvVar2->index + 1;
        pvVar2 = std::
                 vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>::
                 back((vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
                       *)in_stack_ffffffffffffff70);
        pvVar2->mode = map_value;
        read_item(in_stack_00000180,in_stack_00000178,in_stack_00000170);
      }
      else {
        end_object(in_stack_ffffffffffffff80,(item_event_visitor *)in_stack_ffffffffffffff78,
                   in_stack_ffffffffffffff70);
      }
      break;
    case (stream_source<unsigned_char> *)0x5:
      pvVar2 = std::
               vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>::
               back((vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
                     *)in_stack_ffffffffffffff70);
      pvVar2->mode = map_key;
      read_item(in_stack_00000180,in_stack_00000178,in_stack_00000170);
      break;
    case (stream_source<unsigned_char> *)0x6:
      cVar1 = stream_source<unsigned_char>::peek(in_stack_ffffffffffffff78);
      if (((ushort)cVar1 & 0x100) != 0) {
        std::error_code::operator=
                  ((error_code *)in_stack_ffffffffffffff80,
                   (cbor_errc)((ulong)in_stack_ffffffffffffff78 >> 0x20));
        in_RDI[8] = (allocator<char>)0x0;
        return;
      }
      local_1c = cVar1.value;
      if (local_1c == 0xff) {
        stream_source<unsigned_char>::ignore(this_00,in_stack_ffffffffffffff88);
        end_object(in_stack_ffffffffffffff80,(item_event_visitor *)in_stack_ffffffffffffff78,
                   in_stack_ffffffffffffff70);
      }
      else {
        pvVar2 = std::
                 vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>::
                 back((vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
                       *)in_stack_ffffffffffffff70);
        pvVar2->mode = indefinite_map_value;
        read_item(in_stack_00000180,in_stack_00000178,in_stack_00000170);
      }
      break;
    case (stream_source<unsigned_char> *)0x7:
      pvVar2 = std::
               vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>::
               back((vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
                     *)in_stack_ffffffffffffff70);
      pvVar2->mode = indefinite_map_key;
      read_item(in_stack_00000180,in_stack_00000178,in_stack_00000170);
      break;
    case (stream_source<unsigned_char> *)0x8:
      pvVar2 = std::
               vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>::
               back((vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
                     *)in_stack_ffffffffffffff70);
      if (pvVar2->index == 0) {
        pvVar2 = std::
                 vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>::
                 back((vector<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
                       *)in_stack_ffffffffffffff70);
        pvVar2->index = pvVar2->index + 1;
        read_item(in_stack_00000180,in_stack_00000178,in_stack_00000170);
      }
      else {
        produce_end_multi_dim
                  (in_stack_ffffffffffffff80,(item_event_visitor *)in_stack_ffffffffffffff78,
                   in_stack_ffffffffffffff70);
      }
    }
  }
  return;
}

Assistant:

void parse(item_event_visitor& visitor, std::error_code& ec)
    {
        while (!done_ && more_)
        {
            switch (state_stack_.back().mode)
            {
                case parse_mode::multi_dim:
                {
                    if (state_stack_.back().index == 0)
                    {
                        ++state_stack_.back().index;
                        read_item(visitor, ec);
                    }
                    else
                    {
                        produce_end_multi_dim(visitor, ec);
                    }
                    break;
                }
                case parse_mode::array:
                {
                    if (state_stack_.back().index < state_stack_.back().length)
                    {
                        ++state_stack_.back().index;
                        read_item(visitor, ec);
                    }
                    else
                    {
                        end_array(visitor, ec);
                    }
                    break;
                }
                case parse_mode::indefinite_array:
                {
                    auto c = source_.peek();
                    if (JSONCONS_UNLIKELY(c.eof))
                    {
                        ec = cbor_errc::unexpected_eof;
                        more_ = false;
                        return;
                    }
                    if (c.value == 0xff)
                    {
                        source_.ignore(1);
                        end_array(visitor, ec);
                    }
                    else
                    {
                        read_item(visitor, ec);
                    }
                    break;
                }
                case parse_mode::map_key:
                {
                    if (state_stack_.back().index < state_stack_.back().length)
                    {
                        ++state_stack_.back().index;
                        state_stack_.back().mode = parse_mode::map_value;
                        read_item(visitor, ec);
                    }
                    else
                    {
                        end_object(visitor, ec);
                    }
                    break;
                }
                case parse_mode::map_value:
                {
                    state_stack_.back().mode = parse_mode::map_key;
                    read_item(visitor, ec);
                    break;
                }
                case parse_mode::indefinite_map_key:
                {
                    auto c = source_.peek();
                    if (JSONCONS_UNLIKELY(c.eof))
                    {
                        ec = cbor_errc::unexpected_eof;
                        more_ = false;
                        return;
                    }
                    if (c.value == 0xff)
                    {
                        source_.ignore(1);
                        end_object(visitor, ec);
                    }
                    else
                    {
                        state_stack_.back().mode = parse_mode::indefinite_map_value;
                        read_item(visitor, ec);
                    }
                    break;
                }
                case parse_mode::indefinite_map_value:
                {
                    state_stack_.back().mode = parse_mode::indefinite_map_key;
                    read_item(visitor, ec);
                    break;
                }
                case parse_mode::root:
                {
                    state_stack_.back().mode = parse_mode::accept;
                    read_item(visitor, ec);
                    break;
                }
                case parse_mode::accept:
                {
                    JSONCONS_ASSERT(state_stack_.size() == 1);
                    state_stack_.clear();
                    more_ = false;
                    done_ = true;
                    visitor.flush();
                    break;
                }
            }
        }
    }